

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O3

void __thiscall clickhouse::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64_t value)

{
  ulong uVar1;
  uint8_t bytes [10];
  byte abStack_b [11];
  
  uVar1 = 1;
  do {
    abStack_b[uVar1] = (0x7f < value) << 7 | (byte)value & 0x7f;
    if (value < 0x80) goto LAB_00135da1;
    value = value >> 7;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xb);
  uVar1 = 10;
LAB_00135da1:
  (*(this->output_->super_OutputStream)._vptr_OutputStream[3])
            (this->output_,abStack_b + 1,uVar1 & 0xffffffff);
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64(uint64_t value) {
    uint8_t bytes[MAX_VARINT_BYTES];
    int size = 0;

    for (size_t i = 0; i < MAX_VARINT_BYTES; ++i) {
        uint8_t byte = value & 0x7F;
        if (value > 0x7F)
            byte |= 0x80;

        bytes[size++] = byte;

        value >>= 7;
        if (!value) {
            break;
        }
    }

    WriteRaw(bytes, size);
}